

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O2

char * SimpleString::StrNCpy(char *s1,char *s2,size_t n)

{
  size_t sVar1;
  char cVar2;
  char *result;
  
  if (n != 0 && s1 != (char *)0x0) {
    cVar2 = *s2;
    *s1 = cVar2;
    sVar1 = 1;
    while ((n != sVar1 && (cVar2 != '\0'))) {
      cVar2 = s2[sVar1];
      s1[sVar1] = cVar2;
      sVar1 = sVar1 + 1;
    }
  }
  return s1;
}

Assistant:

char* SimpleString::StrNCpy(char* s1, const char* s2, size_t n)
{
    char* result = s1;

    if((NULLPTR == s1) || (0 == n)) return result;

    *s1 = *s2;
    while ((--n != 0) && *s1){
        *++s1 = *++s2;
    }
    return result;
}